

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O1

void tommy_hashlin_insert
               (tommy_hashlin *hashlin,tommy_hashlin_node *node,void *data,tommy_hash_t hash)

{
  tommy_hashlin_node *ptVar1;
  tommy_hashlin_node **pptVar2;
  tommy_node_struct *ptVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  tommy_count_t tVar7;
  tommy_node_struct *ptVar8;
  void *pvVar9;
  tommy_uint_t tVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  tommy_node_struct *ptVar14;
  long in_FS_OFFSET;
  tommy_hashlin_node **local_28 [3];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = hashlin->low_mask & hash;
  if (uVar6 < hashlin->split) {
    uVar6 = hashlin->bucket_mask & hash;
  }
  uVar11 = 0x1f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  ptVar1 = hashlin->bucket[uVar11][uVar6];
  if (ptVar1 == (tommy_hashlin_node *)0x0) {
    ptVar8 = (tommy_node_struct *)(hashlin->bucket[uVar11] + uVar6);
    node->prev = node;
    node->next = (tommy_node_struct *)0x0;
  }
  else {
    node->prev = ptVar1->prev;
    ptVar1->prev = node;
    node->next = (tommy_node_struct *)0x0;
    ptVar8 = node->prev;
  }
  ptVar8->next = node;
  node->data = data;
  node->key = hash;
  uVar6 = hashlin->count + 1;
  hashlin->count = uVar6;
  if (hashlin->state != 1) {
    uVar11 = hashlin->bucket_max;
    if (uVar11 >> 1 < uVar6) {
      if (hashlin->state == 0) {
        hashlin->low_max = uVar11;
        hashlin->low_mask = hashlin->bucket_mask;
        pvVar9 = lrtr_malloc((ulong)uVar11 * 8);
        uVar6 = hashlin->bucket_bit;
        hashlin->bucket[uVar6] =
             (tommy_hashlin_node **)((long)pvVar9 + (ulong)hashlin->low_max * -8);
        tVar10 = uVar6 + 1;
        hashlin->bucket_bit = tVar10;
        tVar7 = 1 << ((byte)tVar10 & 0x1f);
        hashlin->bucket_max = tVar7;
        hashlin->bucket_mask = tVar7 - 1;
        hashlin->split = 0;
      }
      hashlin->state = 1;
    }
  }
  if (hashlin->state == 1) {
    uVar5 = hashlin->count * 2;
    uVar6 = hashlin->low_max;
    uVar11 = hashlin->split;
    if (uVar11 + uVar6 < uVar5) {
      uVar12 = (ulong)(uVar11 + uVar6);
      do {
        uVar4 = 0x1f;
        if ((uVar11 | 1) != 0) {
          for (; (uVar11 | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        local_28[0] = hashlin->bucket[uVar4] + uVar11;
        uVar13 = (uint)uVar12 | 1;
        uVar4 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        pptVar2 = hashlin->bucket[uVar4];
        local_28[1] = pptVar2 + uVar12;
        ptVar1 = *local_28[0];
        *local_28[0] = (tommy_hashlin_node *)0x0;
        pptVar2[uVar12] = (tommy_hashlin_node *)0x0;
        while (ptVar1 != (tommy_hashlin_node *)0x0) {
          ptVar8 = ptVar1->next;
          ptVar14 = (tommy_node_struct *)local_28[(ptVar1->key & uVar6) != 0];
          ptVar3 = ptVar14->next;
          if (ptVar3 == (tommy_node_struct *)0x0) {
            ptVar1->prev = ptVar1;
            ptVar1->next = (tommy_node_struct *)0x0;
          }
          else {
            ptVar1->prev = ptVar3->prev;
            ptVar3->prev = ptVar1;
            ptVar1->next = (tommy_node_struct *)0x0;
            ptVar14 = ptVar1->prev;
          }
          ptVar14->next = ptVar1;
          ptVar1 = ptVar8;
        }
        uVar11 = uVar11 + 1;
        if (uVar11 == uVar6) {
          hashlin->state = 0;
          hashlin->low_max = hashlin->bucket_max;
          hashlin->low_mask = hashlin->bucket_mask;
          hashlin->split = 0;
          goto LAB_001108a9;
        }
        uVar12 = uVar12 + 1;
      } while ((uint)uVar12 < uVar5);
      hashlin->split = uVar11;
    }
  }
LAB_001108a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_hashlin_insert(tommy_hashlin* hashlin, tommy_hashlin_node* node, void* data, tommy_hash_t hash)
{
	tommy_list_insert_tail(tommy_hashlin_bucket_ref(hashlin, hash), node, data);

	node->key = hash;

	++hashlin->count;

	hashlin_grow_step(hashlin);
}